

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.hpp
# Opt level: O3

size_t __thiscall pg::bitset::find_next(bitset *this,size_t pos)

{
  ulong uVar1;
  uint64_t *puVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((pos != 0xffffffffffffffff) && (uVar6 = pos + 1, uVar6 < this->_size)) {
    puVar2 = this->_bits;
    uVar5 = uVar6 >> 6;
    uVar8 = (puVar2[uVar5] >> (uVar6 & 0x3f)) << (uVar6 & 0x3f);
    if (uVar8 != 0) {
      uVar5 = 0;
      for (; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
        uVar5 = uVar5 + 1;
      }
      return uVar5 | uVar6 & 0xffffffffffffffc0;
    }
    uVar6 = this->_bitssize;
    uVar8 = uVar5 + 1;
    if (uVar5 + 1 < uVar6) {
      uVar8 = uVar6;
    }
    do {
      uVar1 = uVar5 + 1;
      uVar7 = uVar8;
      if (uVar6 <= uVar1) break;
      lVar3 = uVar5 + 1;
      uVar5 = uVar1;
      uVar7 = uVar1;
    } while (puVar2[lVar3] == 0);
    if (uVar7 != uVar6) {
      lVar3 = 0;
      for (uVar6 = puVar2[uVar7]; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
        lVar3 = lVar3 + 1;
      }
      lVar4 = -1;
      if (puVar2[uVar7] != 0) {
        lVar4 = lVar3;
      }
      return lVar4 + uVar7 * 0x40;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t find_next(size_t pos) const
    {
        if (pos == npos or (pos+1) >= _size) return npos;
        pos++;
        size_t i = block_index(pos);
        uint64_t m = _bits[i] & (~uint64_t(0) << bit_index(pos));
        if (m) {
            return i*64 + __builtin_ffsll(m) - 1;
        } else {
            i += 1;
            while (i < num_blocks() and _bits[i] == 0) i++;
            if (i == num_blocks()) return npos;
            else return i*64 + __builtin_ffsll(_bits[i]) - 1;
        }
    }